

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upper_bound.cpp
# Opt level: O2

double __thiscall
despot::ParticleUpperBound::Value
          (ParticleUpperBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  double dVar1;
  pointer ppSVar2;
  int i;
  ulong uVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  
  dVar4 = 0.0;
  uVar3 = 0;
  while( true ) {
    ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(particles->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3) <= uVar3) break;
    dVar1 = ppSVar2[uVar3]->weight;
    (*(this->super_ScenarioUpperBound)._vptr_ScenarioUpperBound[4])(this);
    dVar4 = dVar4 + extraout_XMM0_Qa * dVar1;
    uVar3 = uVar3 + 1;
  }
  return dVar4;
}

Assistant:

double ParticleUpperBound::Value(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	double value = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		value += particle->weight * Value(*particle);
	}
	return value;
}